

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

void bson_iter_array(bson_iter_t *iter,uint32_t *array_len,uint8_t **array)

{
  uint8_t *puVar1;
  char *extraout_RDX;
  char *unaff_RBX;
  uint unaff_EBP;
  bson_iter_t *unaff_R14;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_array_cold_3();
LAB_001107de:
    bson_iter_array_cold_2();
  }
  else {
    if (array_len == (uint32_t *)0x0) goto LAB_001107de;
    if (array != (uint8_t **)0x0) {
      *array = (uint8_t *)0x0;
      *array_len = 0;
      if (iter->raw[iter->type] == '\x04') {
        *array_len = *(uint32_t *)(iter->raw + iter->d1);
        *array = iter->raw + iter->d1;
      }
      return;
    }
  }
  bson_iter_array_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_find_cold_3();
LAB_00110869:
    bson_iter_init_find_cold_2();
LAB_0011086e:
    bson_iter_init_find_cold_1();
  }
  else {
    if ((bson_t *)array_len == (bson_t *)0x0) goto LAB_00110869;
    unaff_RBX = extraout_RDX;
    if (extraout_RDX == (char *)0x0) goto LAB_0011086e;
    unaff_EBP = ((bson_t *)array_len)->len;
    unaff_R14 = iter;
    if (4 < unaff_EBP) {
      puVar1 = bson_get_data((bson_t *)array_len);
      iter->raw = puVar1;
      iter->len = ((bson_t *)array_len)->len;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->next_off = 4;
      iter->err_off = 0;
      goto LAB_00110838;
    }
  }
  (unaff_R14->value).value.v_regex.options = (char *)0x0;
  *(undefined8 *)((long)&(unaff_R14->value).value + 0x10) = 0;
  (unaff_R14->value).value_type = BSON_TYPE_EOD;
  (unaff_R14->value).padding = 0;
  (unaff_R14->value).value.v_int64 = 0;
  unaff_R14->d3 = 0;
  unaff_R14->d4 = 0;
  unaff_R14->next_off = 0;
  unaff_R14->err_off = 0;
  unaff_R14->type = 0;
  unaff_R14->key = 0;
  unaff_R14->d1 = 0;
  unaff_R14->d2 = 0;
  unaff_R14->raw = (uint8_t *)0x0;
  unaff_R14->len = 0;
  unaff_R14->off = 0;
LAB_00110838:
  if (4 < unaff_EBP) {
    _bson_iter_find_with_len(unaff_R14,unaff_RBX,-1);
    return;
  }
  return;
}

Assistant:

void
bson_iter_array (const bson_iter_t *iter, /* IN */
                 uint32_t *array_len,     /* OUT */
                 const uint8_t **array)   /* OUT */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (array_len);
   BSON_ASSERT (array);

   *array = NULL;
   *array_len = 0;

   if (ITER_TYPE (iter) == BSON_TYPE_ARRAY) {
      memcpy (array_len, (iter->raw + iter->d1), sizeof (*array_len));
      *array_len = BSON_UINT32_FROM_LE (*array_len);
      *array = (iter->raw + iter->d1);
   }
}